

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

MppDevBatTask * batch_add(MppDevBatServ *server)

{
  list_head *plVar1;
  int iVar2;
  list_head *plVar3;
  MppDevBatTask *batch;
  
  batch = (MppDevBatTask *)mpp_mem_pool_get_f("batch_add",server->batch_pool);
  if (batch == (MppDevBatTask *)0x0) {
    _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","batch_add",0xb7)
    ;
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  else {
    plVar1 = &batch->link_server;
    (batch->link_server).next = plVar1;
    (batch->link_server).prev = plVar1;
    (batch->link_tasks).next = &batch->link_tasks;
    (batch->link_tasks).prev = &batch->link_tasks;
    batch->send_reqs = (MppReqV1 *)(batch + 1);
    iVar2 = server->max_task_in_batch;
    batch->wait_reqs = (MppReqV1 *)(batch + (long)iVar2 * 4 + 1);
    batch->bat_cmd = (MppDevBatCmd *)(&batch[(long)iVar2 * 4 + 1].cond + (long)iVar2 * 6);
    batch_reset(batch);
    plVar3 = (server->list_batch_free).prev;
    (server->list_batch_free).prev = plVar1;
    (batch->link_server).next = &server->list_batch_free;
    (batch->link_server).prev = plVar3;
    plVar3->next = plVar1;
    server->batch_free = server->batch_free + 1;
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch add free count %d:%d\n",(char *)0x0,
                 (ulong)(uint)server->batch_run);
    }
  }
  return batch;
}

Assistant:

MppDevBatTask *batch_add(MppDevBatServ *server)
{
    MppDevBatTask *batch = (MppDevBatTask *)mpp_mem_pool_get(server->batch_pool);

    mpp_assert(batch);
    if (NULL == batch)
        return batch;

    INIT_LIST_HEAD(&batch->link_server);
    INIT_LIST_HEAD(&batch->link_tasks);

    batch->send_reqs = (MppReqV1 *)(batch + 1);
    batch->wait_reqs = batch->send_reqs +
                       (server->max_task_in_batch * MAX_REQ_SEND_CNT);
    batch->bat_cmd = (MppDevBatCmd *)(batch->wait_reqs +
                                      (server->max_task_in_batch * MAX_REQ_WAIT_CNT));

    batch_reset(batch);
    list_add_tail(&batch->link_server, &server->list_batch_free);
    server->batch_free++;

    mpp_serv_dbg_flow("batch add free count %d:%d\n", server->batch_run, server->batch_free);
    return batch;
}